

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,size_t i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  BufferView<embree::Vec3fx> *pBVar14;
  char *pcVar15;
  size_t sVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [12];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  long lVar31;
  long lVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar38 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  float in_register_0000129c;
  undefined1 auVar64 [16];
  float in_register_0000135c;
  float fVar67;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  undefined4 uStack_10c;
  
  pBVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices
            .items;
  uVar13 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.field_0x68);
  pcVar15 = (pBVar14->super_RawBufferView).ptr_ofs;
  sVar16 = (pBVar14->super_RawBufferView).stride;
  lVar31 = (uVar13 + 1) * sVar16;
  lVar32 = (uVar13 + 2) * sVar16;
  lVar33 = (uVar13 + 3) * sVar16;
  fVar37 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar1 = *(float *)(pcVar15 + lVar31);
  fVar2 = *(float *)(pcVar15 + lVar32);
  fVar3 = *(float *)(pcVar15 + lVar32 + 4);
  fVar4 = *(float *)(pcVar15 + lVar32 + 8);
  auVar63 = vshufps_avx(ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar32 + 0xc))),
                        ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar32 + 0xc))),0);
  fVar5 = *(float *)(pcVar15 + lVar33);
  fVar6 = *(float *)(pcVar15 + lVar33 + 4);
  fVar7 = *(float *)(pcVar15 + lVar33 + 8);
  auVar21 = vshufps_avx(ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar33 + 0xc))),
                        ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar33 + 0xc))),0);
  fVar76 = auVar21._0_4_;
  fVar77 = auVar21._4_4_;
  fVar78 = auVar21._8_4_;
  fVar79 = auVar63._0_4_;
  fVar81 = auVar63._4_4_;
  fVar82 = auVar63._8_4_;
  fVar83 = auVar63._12_4_;
  fVar8 = *(float *)(pcVar15 + lVar31 + 4);
  fVar9 = *(float *)(pcVar15 + lVar31 + 8);
  auVar63 = vshufps_avx(ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar31 + 0xc))),
                        ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar31 + 0xc))),0);
  fVar84 = auVar63._0_4_;
  fVar85 = auVar63._4_4_;
  fVar86 = auVar63._8_4_;
  fVar67 = (float)bspline_basis0._2816_4_ + (float)bspline_basis0._3972_4_ + 0.0;
  lVar31 = uVar13 * sVar16;
  fVar10 = *(float *)(pcVar15 + lVar31);
  fVar34 = fVar1 * (float)bspline_basis0._1632_4_ +
           fVar2 * (float)bspline_basis0._2788_4_ + fVar5 * (float)bspline_basis0._3944_4_ +
           fVar10 * (float)bspline_basis0._476_4_;
  fVar39 = fVar1 * (float)bspline_basis0._1636_4_ +
           fVar2 * (float)bspline_basis0._2792_4_ + fVar5 * (float)bspline_basis0._3948_4_ +
           fVar10 * (float)bspline_basis0._480_4_;
  fVar43 = fVar1 * (float)bspline_basis0._1640_4_ +
           fVar2 * (float)bspline_basis0._2796_4_ + fVar5 * (float)bspline_basis0._3952_4_ +
           fVar10 * (float)bspline_basis0._484_4_;
  fVar47 = fVar1 * (float)bspline_basis0._1644_4_ +
           fVar2 * (float)bspline_basis0._2800_4_ + fVar5 * (float)bspline_basis0._3956_4_ +
           fVar10 * (float)bspline_basis0._488_4_;
  fVar51 = fVar1 * (float)bspline_basis0._1648_4_ +
           fVar2 * (float)bspline_basis0._2804_4_ + fVar5 * (float)bspline_basis0._3960_4_ +
           fVar10 * (float)bspline_basis0._492_4_;
  fVar54 = fVar1 * (float)bspline_basis0._1652_4_ +
           fVar2 * (float)bspline_basis0._2808_4_ + fVar5 * (float)bspline_basis0._3964_4_ +
           fVar10 * (float)bspline_basis0._496_4_;
  fVar57 = fVar1 * (float)bspline_basis0._1656_4_ +
           fVar2 * (float)bspline_basis0._2812_4_ + fVar5 * (float)bspline_basis0._3968_4_ +
           fVar10 * (float)bspline_basis0._500_4_;
  fVar60 = (float)bspline_basis0._3972_4_ + fVar2 + in_register_0000129c +
           (float)bspline_basis0._2816_4_ + (float)bspline_basis0._3972_4_;
  fVar11 = *(float *)(pcVar15 + lVar31 + 4);
  fVar35 = fVar11 * (float)bspline_basis0._476_4_ +
           fVar8 * (float)bspline_basis0._1632_4_ +
           fVar3 * (float)bspline_basis0._2788_4_ + fVar6 * (float)bspline_basis0._3944_4_;
  fVar40 = fVar11 * (float)bspline_basis0._480_4_ +
           fVar8 * (float)bspline_basis0._1636_4_ +
           fVar3 * (float)bspline_basis0._2792_4_ + fVar6 * (float)bspline_basis0._3948_4_;
  fVar44 = fVar11 * (float)bspline_basis0._484_4_ +
           fVar8 * (float)bspline_basis0._1640_4_ +
           fVar3 * (float)bspline_basis0._2796_4_ + fVar6 * (float)bspline_basis0._3952_4_;
  fVar48 = fVar11 * (float)bspline_basis0._488_4_ +
           fVar8 * (float)bspline_basis0._1644_4_ +
           fVar3 * (float)bspline_basis0._2800_4_ + fVar6 * (float)bspline_basis0._3956_4_;
  fVar52 = fVar11 * (float)bspline_basis0._492_4_ +
           fVar8 * (float)bspline_basis0._1648_4_ +
           fVar3 * (float)bspline_basis0._2804_4_ + fVar6 * (float)bspline_basis0._3960_4_;
  fVar55 = fVar11 * (float)bspline_basis0._496_4_ +
           fVar8 * (float)bspline_basis0._1652_4_ +
           fVar3 * (float)bspline_basis0._2808_4_ + fVar6 * (float)bspline_basis0._3964_4_;
  fVar58 = fVar11 * (float)bspline_basis0._500_4_ +
           fVar8 * (float)bspline_basis0._1656_4_ +
           fVar3 * (float)bspline_basis0._2812_4_ + fVar6 * (float)bspline_basis0._3968_4_;
  fVar61 = fVar60 + fVar2 + in_register_0000129c + fVar2 + fVar6;
  fVar12 = *(float *)(pcVar15 + lVar31 + 8);
  fVar36 = fVar12 * (float)bspline_basis0._476_4_ +
           fVar9 * (float)bspline_basis0._1632_4_ +
           fVar4 * (float)bspline_basis0._2788_4_ + fVar7 * (float)bspline_basis0._3944_4_;
  fVar41 = fVar12 * (float)bspline_basis0._480_4_ +
           fVar9 * (float)bspline_basis0._1636_4_ +
           fVar4 * (float)bspline_basis0._2792_4_ + fVar7 * (float)bspline_basis0._3948_4_;
  fVar45 = fVar12 * (float)bspline_basis0._484_4_ +
           fVar9 * (float)bspline_basis0._1640_4_ +
           fVar4 * (float)bspline_basis0._2796_4_ + fVar7 * (float)bspline_basis0._3952_4_;
  fVar49 = fVar12 * (float)bspline_basis0._488_4_ +
           fVar9 * (float)bspline_basis0._1644_4_ +
           fVar4 * (float)bspline_basis0._2800_4_ + fVar7 * (float)bspline_basis0._3956_4_;
  fVar53 = fVar12 * (float)bspline_basis0._492_4_ +
           fVar9 * (float)bspline_basis0._1648_4_ +
           fVar4 * (float)bspline_basis0._2804_4_ + fVar7 * (float)bspline_basis0._3960_4_;
  fVar56 = fVar12 * (float)bspline_basis0._496_4_ +
           fVar9 * (float)bspline_basis0._1652_4_ +
           fVar4 * (float)bspline_basis0._2808_4_ + fVar7 * (float)bspline_basis0._3964_4_;
  fVar59 = fVar12 * (float)bspline_basis0._500_4_ +
           fVar9 * (float)bspline_basis0._1656_4_ +
           fVar4 * (float)bspline_basis0._2812_4_ + fVar7 * (float)bspline_basis0._3968_4_;
  fVar62 = fVar61 + fVar2 + fVar6 + fVar2 + in_register_0000135c;
  auVar22 = vshufps_avx(ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar31 + 0xc))),
                        ZEXT416((uint)(fVar37 * *(float *)(pcVar15 + lVar31 + 0xc))),0);
  fVar37 = auVar22._0_4_;
  fVar42 = auVar22._4_4_;
  fVar46 = auVar22._8_4_;
  fVar50 = auVar22._12_4_;
  auVar73._0_4_ =
       fVar37 * (float)bspline_basis0._476_4_ +
       fVar84 * (float)bspline_basis0._1632_4_ +
       fVar79 * (float)bspline_basis0._2788_4_ + fVar76 * (float)bspline_basis0._3944_4_;
  auVar73._4_4_ =
       fVar42 * (float)bspline_basis0._480_4_ +
       fVar85 * (float)bspline_basis0._1636_4_ +
       fVar81 * (float)bspline_basis0._2792_4_ + fVar77 * (float)bspline_basis0._3948_4_;
  auVar73._8_4_ =
       fVar46 * (float)bspline_basis0._484_4_ +
       fVar86 * (float)bspline_basis0._1640_4_ +
       fVar82 * (float)bspline_basis0._2796_4_ + fVar78 * (float)bspline_basis0._3952_4_;
  auVar73._12_4_ =
       fVar50 * (float)bspline_basis0._488_4_ +
       auVar63._12_4_ * (float)bspline_basis0._1644_4_ +
       fVar83 * (float)bspline_basis0._2800_4_ + auVar21._12_4_ * (float)bspline_basis0._3956_4_;
  auVar73._16_4_ =
       fVar37 * (float)bspline_basis0._492_4_ +
       fVar84 * (float)bspline_basis0._1648_4_ +
       fVar79 * (float)bspline_basis0._2804_4_ + fVar76 * (float)bspline_basis0._3960_4_;
  auVar73._20_4_ =
       fVar42 * (float)bspline_basis0._496_4_ +
       fVar85 * (float)bspline_basis0._1652_4_ +
       fVar81 * (float)bspline_basis0._2808_4_ + fVar77 * (float)bspline_basis0._3964_4_;
  auVar73._24_4_ =
       fVar46 * (float)bspline_basis0._500_4_ +
       fVar86 * (float)bspline_basis0._1656_4_ +
       fVar82 * (float)bspline_basis0._2812_4_ + fVar78 * (float)bspline_basis0._3968_4_;
  auVar73._28_4_ = (float)bspline_basis0._504_4_ + fVar67;
  auVar65._0_4_ =
       (float)bspline_basis0._5100_4_ * fVar10 +
       (float)bspline_basis0._6256_4_ * fVar1 +
       (float)bspline_basis0._7412_4_ * fVar2 + fVar5 * (float)bspline_basis0._8568_4_;
  auVar65._4_4_ =
       (float)bspline_basis0._5104_4_ * fVar10 +
       (float)bspline_basis0._6260_4_ * fVar1 +
       (float)bspline_basis0._7416_4_ * fVar2 + fVar5 * (float)bspline_basis0._8572_4_;
  auVar65._8_4_ =
       (float)bspline_basis0._5108_4_ * fVar10 +
       (float)bspline_basis0._6264_4_ * fVar1 +
       (float)bspline_basis0._7420_4_ * fVar2 + fVar5 * (float)bspline_basis0._8576_4_;
  auVar65._12_4_ =
       (float)bspline_basis0._5112_4_ * fVar10 +
       (float)bspline_basis0._6268_4_ * fVar1 +
       (float)bspline_basis0._7424_4_ * fVar2 + fVar5 * (float)bspline_basis0._8580_4_;
  auVar65._16_4_ =
       (float)bspline_basis0._5116_4_ * fVar10 +
       (float)bspline_basis0._6272_4_ * fVar1 +
       (float)bspline_basis0._7428_4_ * fVar2 + fVar5 * (float)bspline_basis0._8584_4_;
  auVar65._20_4_ =
       (float)bspline_basis0._5120_4_ * fVar10 +
       (float)bspline_basis0._6276_4_ * fVar1 +
       (float)bspline_basis0._7432_4_ * fVar2 + fVar5 * (float)bspline_basis0._8588_4_;
  auVar65._24_4_ =
       (float)bspline_basis0._5124_4_ * fVar10 +
       (float)bspline_basis0._6280_4_ * fVar1 +
       (float)bspline_basis0._7436_4_ * fVar2 + fVar5 * (float)bspline_basis0._8592_4_;
  auVar65._28_4_ = fVar10 + fVar83 + fVar83 + fVar67;
  auVar68._0_4_ =
       fVar8 * (float)bspline_basis0._6256_4_ +
       (float)bspline_basis0._7412_4_ * fVar3 + (float)bspline_basis0._8568_4_ * fVar6 +
       (float)bspline_basis0._5100_4_ * fVar11;
  auVar68._4_4_ =
       fVar8 * (float)bspline_basis0._6260_4_ +
       (float)bspline_basis0._7416_4_ * fVar3 + (float)bspline_basis0._8572_4_ * fVar6 +
       (float)bspline_basis0._5104_4_ * fVar11;
  auVar68._8_4_ =
       fVar8 * (float)bspline_basis0._6264_4_ +
       (float)bspline_basis0._7420_4_ * fVar3 + (float)bspline_basis0._8576_4_ * fVar6 +
       (float)bspline_basis0._5108_4_ * fVar11;
  auVar68._12_4_ =
       fVar8 * (float)bspline_basis0._6268_4_ +
       (float)bspline_basis0._7424_4_ * fVar3 + (float)bspline_basis0._8580_4_ * fVar6 +
       (float)bspline_basis0._5112_4_ * fVar11;
  auVar68._16_4_ =
       fVar8 * (float)bspline_basis0._6272_4_ +
       (float)bspline_basis0._7428_4_ * fVar3 + (float)bspline_basis0._8584_4_ * fVar6 +
       (float)bspline_basis0._5116_4_ * fVar11;
  auVar68._20_4_ =
       fVar8 * (float)bspline_basis0._6276_4_ +
       (float)bspline_basis0._7432_4_ * fVar3 + (float)bspline_basis0._8588_4_ * fVar6 +
       (float)bspline_basis0._5120_4_ * fVar11;
  auVar68._24_4_ =
       fVar8 * (float)bspline_basis0._6280_4_ +
       (float)bspline_basis0._7436_4_ * fVar3 + (float)bspline_basis0._8592_4_ * fVar6 +
       (float)bspline_basis0._5124_4_ * fVar11;
  auVar68._28_4_ = fVar83 + fVar83 + fVar5 + fVar11;
  auVar70._0_4_ =
       fVar9 * (float)bspline_basis0._6256_4_ +
       (float)bspline_basis0._7412_4_ * fVar4 + fVar7 * (float)bspline_basis0._8568_4_ +
       (float)bspline_basis0._5100_4_ * fVar12;
  auVar70._4_4_ =
       fVar9 * (float)bspline_basis0._6260_4_ +
       (float)bspline_basis0._7416_4_ * fVar4 + fVar7 * (float)bspline_basis0._8572_4_ +
       (float)bspline_basis0._5104_4_ * fVar12;
  auVar70._8_4_ =
       fVar9 * (float)bspline_basis0._6264_4_ +
       (float)bspline_basis0._7420_4_ * fVar4 + fVar7 * (float)bspline_basis0._8576_4_ +
       (float)bspline_basis0._5108_4_ * fVar12;
  auVar70._12_4_ =
       fVar9 * (float)bspline_basis0._6268_4_ +
       (float)bspline_basis0._7424_4_ * fVar4 + fVar7 * (float)bspline_basis0._8580_4_ +
       (float)bspline_basis0._5112_4_ * fVar12;
  auVar70._16_4_ =
       fVar9 * (float)bspline_basis0._6272_4_ +
       (float)bspline_basis0._7428_4_ * fVar4 + fVar7 * (float)bspline_basis0._8584_4_ +
       (float)bspline_basis0._5116_4_ * fVar12;
  auVar70._20_4_ =
       fVar9 * (float)bspline_basis0._6276_4_ +
       (float)bspline_basis0._7432_4_ * fVar4 + fVar7 * (float)bspline_basis0._8588_4_ +
       (float)bspline_basis0._5120_4_ * fVar12;
  auVar70._24_4_ =
       fVar9 * (float)bspline_basis0._6280_4_ +
       (float)bspline_basis0._7436_4_ * fVar4 + fVar7 * (float)bspline_basis0._8592_4_ +
       (float)bspline_basis0._5124_4_ * fVar12;
  auVar70._28_4_ = fVar9 + fVar83 + fVar7 + fVar12;
  auVar72._0_4_ =
       (float)bspline_basis0._5100_4_ * fVar37 +
       fVar84 * (float)bspline_basis0._6256_4_ +
       (float)bspline_basis0._7412_4_ * fVar79 + fVar76 * (float)bspline_basis0._8568_4_;
  auVar72._4_4_ =
       (float)bspline_basis0._5104_4_ * fVar42 +
       fVar85 * (float)bspline_basis0._6260_4_ +
       (float)bspline_basis0._7416_4_ * fVar81 + fVar77 * (float)bspline_basis0._8572_4_;
  auVar72._8_4_ =
       (float)bspline_basis0._5108_4_ * fVar46 +
       fVar86 * (float)bspline_basis0._6264_4_ +
       (float)bspline_basis0._7420_4_ * fVar82 + fVar78 * (float)bspline_basis0._8576_4_;
  auVar72._12_4_ =
       (float)bspline_basis0._5112_4_ * fVar50 +
       auVar63._12_4_ * (float)bspline_basis0._6268_4_ +
       (float)bspline_basis0._7424_4_ * fVar83 + auVar21._12_4_ * (float)bspline_basis0._8580_4_;
  auVar72._16_4_ =
       (float)bspline_basis0._5116_4_ * fVar37 +
       fVar84 * (float)bspline_basis0._6272_4_ +
       (float)bspline_basis0._7428_4_ * fVar79 + fVar76 * (float)bspline_basis0._8584_4_;
  auVar72._20_4_ =
       (float)bspline_basis0._5120_4_ * fVar42 +
       fVar85 * (float)bspline_basis0._6276_4_ +
       (float)bspline_basis0._7432_4_ * fVar81 + fVar77 * (float)bspline_basis0._8588_4_;
  auVar72._24_4_ =
       (float)bspline_basis0._5124_4_ * fVar46 +
       fVar86 * (float)bspline_basis0._6280_4_ +
       (float)bspline_basis0._7436_4_ * fVar82 + fVar78 * (float)bspline_basis0._8592_4_;
  auVar72._28_4_ =
       fVar50 + (float)bspline_basis0._6284_4_ +
                (float)bspline_basis0._7440_4_ + (float)bspline_basis0._8596_4_;
  auVar27 = ZEXT412(0);
  auVar17 = vblendps_avx(auVar65,ZEXT1232(auVar27) << 0x20,1);
  auVar18 = vblendps_avx(auVar68,ZEXT1232(auVar27) << 0x20,1);
  auVar66 = ZEXT1232(auVar27) << 0x20;
  auVar19 = vblendps_avx(auVar70,auVar66,1);
  auVar74 = vblendps_avx(auVar72,auVar66,1);
  auVar24._4_4_ = auVar17._4_4_ * 0.055555556;
  auVar24._0_4_ = auVar17._0_4_ * 0.055555556;
  auVar24._8_4_ = auVar17._8_4_ * 0.055555556;
  auVar24._12_4_ = auVar17._12_4_ * 0.055555556;
  auVar24._16_4_ = auVar17._16_4_ * 0.055555556;
  auVar24._20_4_ = auVar17._20_4_ * 0.055555556;
  auVar24._24_4_ = auVar17._24_4_ * 0.055555556;
  auVar24._28_4_ = auVar17._28_4_;
  auVar17._4_4_ = auVar18._4_4_ * 0.055555556;
  auVar17._0_4_ = auVar18._0_4_ * 0.055555556;
  auVar17._8_4_ = auVar18._8_4_ * 0.055555556;
  auVar17._12_4_ = auVar18._12_4_ * 0.055555556;
  auVar17._16_4_ = auVar18._16_4_ * 0.055555556;
  auVar17._20_4_ = auVar18._20_4_ * 0.055555556;
  auVar17._24_4_ = auVar18._24_4_ * 0.055555556;
  auVar17._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = auVar19._4_4_ * 0.055555556;
  auVar18._0_4_ = auVar19._0_4_ * 0.055555556;
  auVar18._8_4_ = auVar19._8_4_ * 0.055555556;
  auVar18._12_4_ = auVar19._12_4_ * 0.055555556;
  auVar18._16_4_ = auVar19._16_4_ * 0.055555556;
  auVar18._20_4_ = auVar19._20_4_ * 0.055555556;
  auVar18._24_4_ = auVar19._24_4_ * 0.055555556;
  auVar18._28_4_ = fVar9;
  local_128._4_4_ = auVar74._4_4_ * 0.055555556;
  local_128._0_4_ = auVar74._0_4_ * 0.055555556;
  fStack_120 = auVar74._8_4_ * 0.055555556;
  fStack_11c = auVar74._12_4_ * 0.055555556;
  fStack_118 = auVar74._16_4_ * 0.055555556;
  fStack_114 = auVar74._20_4_ * 0.055555556;
  fStack_110 = auVar74._24_4_ * 0.055555556;
  uStack_10c = auVar19._28_4_;
  auVar30._4_4_ = fVar39;
  auVar30._0_4_ = fVar34;
  auVar30._8_4_ = fVar43;
  auVar30._12_4_ = fVar47;
  auVar30._16_4_ = fVar51;
  auVar30._20_4_ = fVar54;
  auVar30._24_4_ = fVar57;
  auVar30._28_4_ = fVar60;
  auVar24 = vsubps_avx(auVar30,auVar24);
  auVar29._4_4_ = fVar40;
  auVar29._0_4_ = fVar35;
  auVar29._8_4_ = fVar44;
  auVar29._12_4_ = fVar48;
  auVar29._16_4_ = fVar52;
  auVar29._20_4_ = fVar55;
  auVar29._24_4_ = fVar58;
  auVar29._28_4_ = fVar61;
  auVar25 = vsubps_avx(auVar29,auVar17);
  auVar28._4_4_ = fVar41;
  auVar28._0_4_ = fVar36;
  auVar28._8_4_ = fVar45;
  auVar28._12_4_ = fVar49;
  auVar28._16_4_ = fVar53;
  auVar28._20_4_ = fVar56;
  auVar28._24_4_ = fVar59;
  auVar28._28_4_ = fVar62;
  auVar26 = vsubps_avx(auVar28,auVar18);
  auVar17 = vblendps_avx(auVar65,auVar66,0x80);
  auVar18 = vblendps_avx(auVar68,auVar66,0x80);
  auVar19 = vblendps_avx(auVar70,ZEXT1232(auVar27) << 0x20,0x80);
  auVar74 = vblendps_avx(auVar72,ZEXT1232(auVar27) << 0x20,0x80);
  auVar80._0_4_ = fVar34 + auVar17._0_4_ * 0.055555556;
  auVar80._4_4_ = fVar39 + auVar17._4_4_ * 0.055555556;
  auVar80._8_4_ = fVar43 + auVar17._8_4_ * 0.055555556;
  auVar80._12_4_ = fVar47 + auVar17._12_4_ * 0.055555556;
  auVar80._16_4_ = fVar51 + auVar17._16_4_ * 0.055555556;
  auVar80._20_4_ = fVar54 + auVar17._20_4_ * 0.055555556;
  auVar80._24_4_ = fVar57 + auVar17._24_4_ * 0.055555556;
  auVar80._28_4_ = fVar60 + auVar17._28_4_;
  auVar69._0_4_ = fVar35 + auVar18._0_4_ * 0.055555556;
  auVar69._4_4_ = fVar40 + auVar18._4_4_ * 0.055555556;
  auVar69._8_4_ = fVar44 + auVar18._8_4_ * 0.055555556;
  auVar69._12_4_ = fVar48 + auVar18._12_4_ * 0.055555556;
  auVar69._16_4_ = fVar52 + auVar18._16_4_ * 0.055555556;
  auVar69._20_4_ = fVar55 + auVar18._20_4_ * 0.055555556;
  auVar69._24_4_ = fVar58 + auVar18._24_4_ * 0.055555556;
  auVar69._28_4_ = fVar61 + auVar18._28_4_;
  auVar71._0_4_ = fVar36 + auVar19._0_4_ * 0.055555556;
  auVar71._4_4_ = fVar41 + auVar19._4_4_ * 0.055555556;
  auVar71._8_4_ = fVar45 + auVar19._8_4_ * 0.055555556;
  auVar71._12_4_ = fVar49 + auVar19._12_4_ * 0.055555556;
  auVar71._16_4_ = fVar53 + auVar19._16_4_ * 0.055555556;
  auVar71._20_4_ = fVar56 + auVar19._20_4_ * 0.055555556;
  auVar71._24_4_ = fVar59 + auVar19._24_4_ * 0.055555556;
  auVar71._28_4_ = fVar62 + auVar19._28_4_;
  auVar66._8_4_ = 0x7f800000;
  auVar66._0_8_ = 0x7f8000007f800000;
  auVar66._12_4_ = 0x7f800000;
  auVar66._16_4_ = 0x7f800000;
  auVar66._20_4_ = 0x7f800000;
  auVar66._24_4_ = 0x7f800000;
  auVar66._28_4_ = 0x7f800000;
  auVar17 = vminps_avx(auVar66,auVar30);
  auVar18 = vminps_avx(auVar66,auVar29);
  auVar19 = vminps_avx(auVar24,auVar80);
  auVar65 = vminps_avx(auVar17,auVar19);
  auVar17 = vminps_avx(auVar25,auVar69);
  auVar68 = vminps_avx(auVar18,auVar17);
  auVar17 = vminps_avx(auVar66,auVar28);
  auVar18 = vminps_avx(auVar26,auVar71);
  auVar70 = vminps_avx(auVar17,auVar18);
  auVar72 = vsubps_avx(auVar73,_local_128);
  auVar75._0_4_ = auVar73._0_4_ + auVar74._0_4_ * 0.055555556;
  auVar75._4_4_ = auVar73._4_4_ + auVar74._4_4_ * 0.055555556;
  auVar75._8_4_ = auVar73._8_4_ + auVar74._8_4_ * 0.055555556;
  auVar75._12_4_ = auVar73._12_4_ + auVar74._12_4_ * 0.055555556;
  auVar75._16_4_ = auVar73._16_4_ + auVar74._16_4_ * 0.055555556;
  auVar75._20_4_ = auVar73._20_4_ + auVar74._20_4_ * 0.055555556;
  auVar75._24_4_ = auVar73._24_4_ + auVar74._24_4_ * 0.055555556;
  auVar75._28_4_ = auVar73._28_4_ + 0.0;
  auVar17 = vminps_avx(auVar66,auVar73);
  auVar18 = vminps_avx(auVar72,auVar75);
  auVar66 = vminps_avx(auVar17,auVar18);
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  auVar74._16_4_ = 0xff800000;
  auVar74._20_4_ = 0xff800000;
  auVar74._24_4_ = 0xff800000;
  auVar74._28_4_ = 0xff800000;
  auVar17 = vmaxps_avx(auVar74,auVar30);
  auVar18 = vmaxps_avx(auVar74,auVar29);
  auVar19 = vmaxps_avx(auVar74,auVar28);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar24 = vmaxps_avx(auVar24,auVar80);
  auVar17 = vmaxps_avx(auVar17,auVar24);
  auVar24 = vmaxps_avx(auVar25,auVar69);
  auVar18 = vmaxps_avx(auVar18,auVar24);
  auVar24 = vmaxps_avx(auVar26,auVar71);
  auVar19 = vmaxps_avx(auVar19,auVar24);
  auVar24 = vmaxps_avx(auVar72,auVar75);
  auVar74 = vmaxps_avx(auVar74,auVar24);
  auVar24 = vshufps_avx(auVar65,auVar65,0xb1);
  auVar24 = vminps_avx(auVar65,auVar24);
  auVar65 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar65);
  auVar63 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar24 = vshufps_avx(auVar68,auVar68,0xb1);
  auVar24 = vminps_avx(auVar68,auVar24);
  auVar65 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar65);
  auVar21 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar21 = vunpcklps_avx(auVar63,auVar21);
  auVar24 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar24 = vminps_avx(auVar70,auVar24);
  auVar65 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar65);
  auVar63 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar22 = vinsertps_avx(auVar21,auVar63,0x28);
  auVar24 = vshufps_avx(auVar17,auVar17,0xb1);
  auVar17 = vmaxps_avx(auVar17,auVar24);
  auVar24 = vshufpd_avx(auVar17,auVar17,5);
  auVar17 = vmaxps_avx(auVar17,auVar24);
  auVar63 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
  auVar17 = vshufps_avx(auVar18,auVar18,0xb1);
  auVar17 = vmaxps_avx(auVar18,auVar17);
  auVar18 = vshufpd_avx(auVar17,auVar17,5);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar21 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
  auVar21 = vunpcklps_avx(auVar63,auVar21);
  auVar17 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar17 = vmaxps_avx(auVar19,auVar17);
  auVar18 = vshufpd_avx(auVar17,auVar17,5);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar63 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
  auVar20 = vinsertps_avx(auVar21,auVar63,0x28);
  auVar17 = vshufps_avx(auVar66,auVar66,0xb1);
  auVar17 = vminps_avx(auVar66,auVar17);
  auVar18 = vshufpd_avx(auVar17,auVar17,5);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar63 = vminss_avx(auVar17._0_16_,auVar17._16_16_);
  auVar17 = vshufps_avx(auVar74,auVar74,0xb1);
  auVar17 = vmaxps_avx(auVar74,auVar17);
  auVar18 = vshufpd_avx(auVar17,auVar17,5);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar21 = vmaxss_avx(auVar17._0_16_,auVar17._16_16_);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  auVar63 = vandps_avx(auVar63,auVar64);
  auVar21 = vandps_avx(auVar21,auVar64);
  auVar63 = vmaxss_avx(auVar21,auVar63);
  auVar63 = vshufps_avx(auVar63,auVar63,0);
  auVar22 = vsubps_avx(auVar22,auVar63);
  auVar38._0_4_ = auVar20._0_4_ + auVar63._0_4_;
  auVar38._4_4_ = auVar20._4_4_ + auVar63._4_4_;
  auVar38._8_4_ = auVar20._8_4_ + auVar63._8_4_;
  auVar38._12_4_ = auVar20._12_4_ + auVar63._12_4_;
  auVar63 = vandps_avx(auVar22,auVar64);
  auVar21 = vandps_avx(auVar38,auVar64);
  auVar63 = vmaxps_avx(auVar63,auVar21);
  auVar21 = vmovshdup_avx(auVar63);
  auVar21 = vmaxss_avx(auVar21,auVar63);
  auVar63 = vshufpd_avx(auVar63,auVar63,1);
  auVar63 = vmaxss_avx(auVar63,auVar21);
  auVar63 = ZEXT416((uint)(auVar63._0_4_ * 4.7683716e-07));
  auVar63 = vshufps_avx(auVar63,auVar63,0);
  aVar23 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar22,auVar63);
  (__return_storage_ptr__->lower).field_0 = aVar23;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar38._0_4_ + auVar63._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar38._4_4_ + auVar63._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar38._8_4_ + auVar63._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar38._12_4_ + auVar63._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }